

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form8_Histogram(HistogramForm8 Histogram)

{
  value_type vVar1;
  value_type vVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  byte *pbVar7;
  code *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  int iVar8;
  uint32_t in_stack_fffffffffffffd5c;
  uint32_t in_stack_fffffffffffffd60;
  undefined2 in_stack_fffffffffffffd64;
  uint8_t in_stack_fffffffffffffd66;
  uint8_t in_stack_fffffffffffffd67;
  undefined8 in_stack_fffffffffffffd68;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined8 in_stack_fffffffffffffd80;
  uint32_t height;
  allocator_type *in_stack_fffffffffffffd88;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffd90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  iterator in_stack_fffffffffffffd98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  size_type in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  value_type vVar9;
  uint32_t *in_stack_fffffffffffffdc8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdd0;
  size_type sVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined1 **local_1b8;
  ImageTemplate<unsigned_char> local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_150;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  undefined1 local_119;
  undefined8 *local_b8;
  undefined1 *local_b0 [5];
  undefined1 local_88 [40];
  undefined8 *local_60;
  undefined8 local_58;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  code *local_20;
  byte local_11;
  
  height = (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  local_20 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffd5c);
  local_119 = 1;
  local_b8 = local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffd70,(uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
             (uint32_t)in_stack_fffffffffffffd68,in_stack_fffffffffffffd67,in_stack_fffffffffffffd66
            );
  Test_Helper::uniformImage
            ((uint8_t)((ulong)in_stack_fffffffffffffd88 >> 0x38),(uint32_t)in_stack_fffffffffffffd88
             ,height,(Image *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_b8 = (undefined8 *)local_88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffd70,(uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
             (uint32_t)in_stack_fffffffffffffd68,in_stack_fffffffffffffd67,in_stack_fffffffffffffd66
            );
  Test_Helper::uniformImage
            ((uint8_t)((ulong)in_stack_fffffffffffffd88 >> 0x38),(uint32_t)in_stack_fffffffffffffd88
             ,height,(Image *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_119 = 0;
  local_60 = local_b0;
  local_58 = 2;
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1d8378);
  __l._M_len = in_stack_fffffffffffffda0;
  __l._M_array = in_stack_fffffffffffffd98;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(in_stack_fffffffffffffd90,__l,in_stack_fffffffffffffd88);
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::~allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1d83ac);
  local_1b8 = (undefined1 **)&local_60;
  do {
    local_1b8 = local_1b8 + -5;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1d83e1);
  } while (local_1b8 != local_b0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d840b);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d8418);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d842d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d8442);
  Unit_Test::generateRoi
            ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             (uint32_t *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  if ((uint)local_178._32_4_ >> 1 == 0) {
    local_11 = 1;
    local_178._data._4_4_ = 1;
  }
  else {
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::operator[](&local_50,1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_138,1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_150,1);
    Unit_Test::fillImage
              (in_stack_fffffffffffffd70,(uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
               (uint32_t)in_stack_fffffffffffffd68,
               CONCAT13(in_stack_fffffffffffffd67,
                        CONCAT12(in_stack_fffffffffffffd66,in_stack_fffffffffffffd64)),
               in_stack_fffffffffffffd60,(uint8_t)(in_stack_fffffffffffffd5c >> 0x18));
    sVar10 = 1;
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::operator[](&local_50,1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_138,sVar10);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_150,sVar10);
    Unit_Test::fillImage
              (in_stack_fffffffffffffd70,(uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
               (uint32_t)in_stack_fffffffffffffd68,
               CONCAT13(in_stack_fffffffffffffd67,
                        CONCAT12(in_stack_fffffffffffffd66,in_stack_fffffffffffffd64)),
               in_stack_fffffffffffffd60,(uint8_t)(in_stack_fffffffffffffd5c >> 0x18));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d8706);
    sVar10 = 0;
    this = &local_50;
    pvVar4 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[](this,0);
    this_00 = &local_138;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar10);
    vVar1 = *pvVar5;
    this_01 = &local_150;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,sVar10);
    vVar2 = *pvVar5;
    sVar10 = 1;
    pvVar6 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[](this,1);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar10);
    vVar9 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,sVar10);
    iVar8 = local_178._36_4_;
    uVar3 = local_178._32_4_;
    (*local_20)(pvVar4,vVar1,vVar2,pvVar6,vVar9,*pvVar5,local_178._36_4_,local_178._32_4_,&local_178
               );
    sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_178);
    local_11 = false;
    if (sVar10 == 0x100) {
      pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_178,
                          (ulong)*pbVar7);
      local_11 = false;
      if (*pvVar5 == local_178._36_4_ * ((uint)local_178._32_4_ >> 1)) {
        in_stack_fffffffffffffd70 = &local_178;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffd5c,iVar8));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffd5c,iVar8));
        __first._M_current._4_2_ = in_stack_fffffffffffffd64;
        __first._M_current._0_4_ = uVar3;
        __first._M_current._6_1_ = in_stack_fffffffffffffd66;
        __first._M_current._7_1_ = in_stack_fffffffffffffd67;
        __last._M_current._4_4_ = in_stack_fffffffffffffd5c;
        __last._M_current._0_4_ = iVar8;
        uVar3 = std::
                accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                          (__first,__last,0);
        local_11 = uVar3 == local_178._36_4_ * ((uint)local_178._32_4_ >> 1);
      }
    }
    local_178._data._4_4_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd70);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd70);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd70);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_fffffffffffffd70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd70);
  return (bool)(local_11 & 1);
}

Assistant:

bool form8_Histogram(HistogramForm8 Histogram)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > image = { uniformImage( intensity[0] ), uniformImage( intensity[1] ) };

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        if ( roiHeight / 2 == 0 )
            return true;

        fillImage( image[1], roiX[1], roiY[1], roiWidth, roiHeight / 2, 255 );
        fillImage( image[1], roiX[1], roiY[1] + roiHeight / 2, roiWidth, roiHeight - roiHeight / 2, 0 );

        std::vector < uint32_t > histogram;
        Histogram( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], roiWidth, roiHeight, histogram );

        return histogram.size() == 256u && histogram[intensity[0]] == roiWidth * (roiHeight / 2) &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == roiWidth * (roiHeight / 2);
    }